

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

bool EV_DoChange(line_t_conflict *line,EChange changetype,int tag)

{
  int iVar1;
  FTextureID FVar2;
  sector_t_conflict *this;
  sector_t_conflict *model;
  double floordestheight;
  FTextureID oldpic;
  FSectorTagIterator it;
  sector_t_conflict *secm;
  sector_t_conflict *sec;
  bool rtn;
  int secnum;
  int tag_local;
  EChange changetype_local;
  line_t_conflict *line_local;
  
  sec._3_1_ = false;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffc8,tag);
  while (iVar1 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffc8),
        -1 < iVar1) {
    this = sectors + iVar1;
    sec._3_1_ = true;
    sector_t::GetTexture((sector_t *)this,0);
    if (changetype == trigChangeOnly) {
      if (line != (line_t_conflict *)0x0) {
        FVar2 = sector_t::GetTexture((sector_t *)line->frontsector,0);
        sector_t::SetTexture((sector_t *)this,0,FVar2,true);
        sector_t::TransferSpecial((sector_t *)this,line->frontsector);
      }
    }
    else if (changetype == numChangeOnly) {
      floordestheight = sector_t::CenterFloor((sector_t *)this);
      model = sector_t::FindModelFloorSector((sector_t *)this,floordestheight);
      if (model != (sector_t_conflict *)0x0) {
        FVar2 = sector_t::GetTexture((sector_t *)model,0);
        sector_t::SetTexture((sector_t *)this,0,FVar2,true);
        sector_t::TransferSpecial((sector_t *)this,model);
      }
    }
  }
  return sec._3_1_;
}

Assistant:

bool EV_DoChange (line_t *line, EChange changetype, int tag)
{
	int			secnum;
	bool		rtn;
	sector_t	*sec;
	sector_t	*secm;

	rtn = false;
	// change all sectors with the same tag as the linedef
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sec = &sectors[secnum];
              
		rtn = true;

		// handle trigger or numeric change type
		FTextureID oldpic = sec->GetTexture(sector_t::floor);

		switch(changetype)
		{
		case trigChangeOnly:
			if (line)
			{ // [RH] if no line, no change
				sec->SetTexture(sector_t::floor, line->frontsector->GetTexture(sector_t::floor));
				sec->TransferSpecial(line->frontsector);
			}
			break;
		case numChangeOnly:
			secm = sec->FindModelFloorSector (sec->CenterFloor());
			if (secm)
			{ // if no model, no change
				sec->SetTexture(sector_t::floor, secm->GetTexture(sector_t::floor));
				sec->TransferSpecial(secm);
			}
			break;
		default:
			break;
		}
	}
	return rtn;
}